

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O3

bool __thiscall DialogPrompt::update(DialogPrompt *this,TextEvent textEvent)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer ppDVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  pointer ppDVar7;
  ulong uVar8;
  ulong uVar9;
  TextField *f;
  pointer pTVar10;
  int local_1c;
  
  ppDVar3 = UserInterface::_dialogPrompts.
            super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->super_UIComponent).super_Transformable.field_0xa9 == '\x01') {
    ppDVar7 = UserInterface::_dialogPrompts.
              super__Vector_base<DialogPrompt_*,_std::allocator<DialogPrompt_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (textEvent.unicode == 0x1b) {
      for (; ppDVar7 != ppDVar3; ppDVar7 = ppDVar7 + 1) {
        ((*ppDVar7)->super_UIComponent).super_Transformable.field_0xa9 = 0;
      }
      UserInterface::_dialogPromptOpen = false;
    }
    else if (textEvent.unicode == 0xd) {
      pTVar1 = (this->optionButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->action).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_1c = pTVar1->actionOption;
        (*(pTVar1->action)._M_invoker)((_Any_data *)&pTVar1->action,&local_1c);
      }
    }
    else if (textEvent.unicode == 9) {
      pTVar10 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar10;
      if (lVar5 != 0) {
        uVar9 = (lVar5 >> 3) * -0x6625d51f86ef9b1d;
        uVar4 = 1;
        uVar8 = 0;
        do {
          uVar6 = uVar4;
          if (pTVar10[uVar8].selected == true) {
            pTVar10[uVar8].selected = false;
            pTVar10[uVar6 % uVar9].selected = true;
            return false;
          }
          uVar4 = (ulong)((int)uVar6 + 1);
          uVar8 = uVar6;
        } while (uVar6 <= uVar9 && uVar9 - uVar6 != 0);
      }
    }
    else {
      pTVar2 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pTVar10 = (this->optionFields).super__Vector_base<TextField,_std::allocator<TextField>_>.
                     _M_impl.super__Vector_impl_data._M_start; pTVar10 != pTVar2;
          pTVar10 = pTVar10 + 1) {
        (*(pTVar10->super_UIComponent).super_Drawable._vptr_Drawable[4])(pTVar10,textEvent.unicode);
      }
    }
  }
  return false;
}

Assistant:

bool DialogPrompt::update(Event::TextEvent textEvent) {
    if (visible) {
        if (textEvent.unicode == 9) {    // If key tab pressed, attempt to switch to next text field.
            for (unsigned int i = 0; i < optionFields.size(); ++i) {
                if (optionFields[i].selected == true) {
                    optionFields[i].selected = false;
                    optionFields[(i + 1) % optionFields.size()].selected = true;
                    break;
                }
            }
        } else if (textEvent.unicode == 13) {    // If key enter pressed, activate the first button (assumed as confirmation action).
            if (optionButtons[0].action != nullptr) {
                optionButtons[0].action(optionButtons[0].actionOption);
            }
        } else if (textEvent.unicode == 27) {    // Escape pressed, close dialog.
            UserInterface::closeAllDialogPrompts();
        } else {    // Else, send the text event to the fields.
            for (TextField& f : optionFields) {
                f.update(textEvent);
            }
        }
    }
    return false;
}